

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_pd.c
# Opt level: O1

void pd_init_systems(void)

{
  mess_init();
  sys_lock();
  obj_init();
  conf_init();
  glob_init();
  garray_init();
  sys_unlock();
  return;
}

Assistant:

EXTERN void pd_init_systems(void) {
    mess_init();
    sys_lock();
    obj_init();
    conf_init();
    glob_init();
    garray_init();
    sys_unlock();
}